

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O0

char * BaseFileSearch(char *file,char *ext,bool lookfirstinprogdir)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  FString local_60;
  FString tmp;
  FString local_48;
  FString local_40;
  FString dir;
  char *value;
  char *key;
  char *pcStack_20;
  bool lookfirstinprogdir_local;
  char *ext_local;
  char *file_local;
  
  if ((file == (char *)0x0) || (*file == '\0')) {
    file_local = (char *)0x0;
  }
  else {
    key._7_1_ = lookfirstinprogdir;
    pcStack_20 = ext;
    ext_local = file;
    if (lookfirstinprogdir) {
      pcVar3 = FString::GetChars(&progdir);
      sVar4 = FString::Len(&progdir);
      pcVar5 = FString::operator[](&progdir,sVar4 - 1);
      pcVar6 = "\x01";
      if (*pcVar5 != '/') {
        pcVar6 = "./";
      }
      mysnprintf(BaseFileSearch::wad,0x1000,"%s%s%s",pcVar3,pcVar6 + 1,ext_local);
      bVar1 = DirEntryExists(BaseFileSearch::wad);
      if (bVar1) {
        file_local = BaseFileSearch::wad;
        return file_local;
      }
    }
    bVar1 = DirEntryExists(ext_local);
    if (bVar1) {
      mysnprintf(BaseFileSearch::wad,0x1000,"%s",ext_local);
      file_local = BaseFileSearch::wad;
    }
    else if ((GameConfig == (FGameConfigFile *)0x0) ||
            (bVar1 = FConfigFile::SetSection
                               (&GameConfig->super_FConfigFile,"FileSearch.Directories",false),
            !bVar1)) {
LAB_00592507:
      if (pcStack_20 == (char *)0x0) {
        file_local = (char *)0x0;
      }
      else {
        FString::FString(&local_60,ext_local);
        DefaultExtension(&local_60,pcStack_20);
        pcVar6 = FString::operator_cast_to_char_(&local_60);
        file_local = BaseFileSearch(pcVar6,(char *)0x0,false);
        tmp.Chars._0_4_ = 1;
        FString::~FString(&local_60);
      }
    }
    else {
      do {
        do {
          bVar1 = FConfigFile::NextInSection(&GameConfig->super_FConfigFile,&value,&dir.Chars);
          if (!bVar1) goto LAB_00592507;
          iVar2 = strcasecmp(value,"Path");
        } while (iVar2 != 0);
        FString::FString(&local_40);
        NicePath((char *)&local_48);
        FString::operator=(&local_40,&local_48);
        FString::~FString(&local_48);
        bVar1 = FString::IsNotEmpty(&local_40);
        if (bVar1) {
          pcVar3 = FString::GetChars(&local_40);
          sVar4 = FString::Len(&local_40);
          pcVar5 = FString::operator[](&local_40,sVar4 - 1);
          pcVar6 = "\x01";
          if (*pcVar5 != '/') {
            pcVar6 = "./";
          }
          mysnprintf(BaseFileSearch::wad,0x1000,"%s%s%s",pcVar3,pcVar6 + 1,ext_local);
          bVar1 = DirEntryExists(BaseFileSearch::wad);
          if (!bVar1) goto LAB_005924d2;
          file_local = BaseFileSearch::wad;
          tmp.Chars._0_4_ = 1;
        }
        else {
LAB_005924d2:
          tmp.Chars._0_4_ = 0;
        }
        FString::~FString(&local_40);
      } while ((int)tmp.Chars == 0);
    }
  }
  return file_local;
}

Assistant:

static const char *BaseFileSearch (const char *file, const char *ext, bool lookfirstinprogdir)
{
	static char wad[PATH_MAX];

	if (file == NULL || *file == '\0')
	{
		return NULL;
	}
	if (lookfirstinprogdir)
	{
		mysnprintf (wad, countof(wad), "%s%s%s", progdir.GetChars(), progdir[progdir.Len() - 1] != '/' ? "/" : "", file);
		if (DirEntryExists (wad))
		{
			return wad;
		}
	}

	if (DirEntryExists (file))
	{
		mysnprintf (wad, countof(wad), "%s", file);
		return wad;
	}

	if (GameConfig != NULL && GameConfig->SetSection ("FileSearch.Directories"))
	{
		const char *key;
		const char *value;

		while (GameConfig->NextInSection (key, value))
		{
			if (stricmp (key, "Path") == 0)
			{
				FString dir;

				dir = NicePath(value);
				if (dir.IsNotEmpty())
				{
					mysnprintf (wad, countof(wad), "%s%s%s", dir.GetChars(), dir[dir.Len() - 1] != '/' ? "/" : "", file);
					if (DirEntryExists (wad))
					{
						return wad;
					}
				}
			}
		}
	}

	// Retry, this time with a default extension
	if (ext != NULL)
	{
		FString tmp = file;
		DefaultExtension (tmp, ext);
		return BaseFileSearch (tmp, NULL);
	}
	return NULL;
}